

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  unsigned_long local_48 [2];
  FormatSpec<unsigned_long,_unsigned_long,_std::basic_string_view<char>,_std::basic_string_view<char>_>
  local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_28._M_len = (size_t)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_28._M_str = (char *)(~local_28._M_len + *(long *)(**(long **)this + 8));
  local_18._M_len = 6;
  local_18._M_str = "uint64";
  local_38.super_type.spec_.data_ = "Value must be integer, from %d to %d, for %s option \"%s\".";
  local_38.super_type.spec_.size_ = 0x39;
  local_48[1] = 0;
  local_48[0] = 0xffffffffffffffff;
  StrFormat<unsigned_long,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (__return_storage_ptr__,&local_38,local_48 + 1,local_48,&local_18,&local_28);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}